

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O3

void __thiscall cursespp::App::CheckShowOverlay(App *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  IWindow *pIVar2;
  App *pAVar3;
  ILayoutPtr top;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  undefined1 local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  OverlayStack::Top(&overlays);
  peVar1 = (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (local_30 != peVar1) {
    if (peVar1 != (element_type *)0x0) {
      (*(peVar1->super_IDisplayable)._vptr_IDisplayable[3])(&peVar1->super_IDisplayable);
    }
    (this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_30;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->state).overlay.
                super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_28);
    if (local_30 == (element_type *)0x0) {
      pIVar2 = (IWindow *)0x0;
    }
    else {
      pIVar2 = (IWindow *)
               __dynamic_cast(local_30,&ILayout::typeinfo,&IWindow::typeinfo,0xfffffffffffffffe);
    }
    (this->state).overlayWindow = pIVar2;
    pAVar3 = (App *)&(this->injectedKeys).c.
                     super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_first;
    if ((this->state).overlay.super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      pAVar3 = this;
    }
    peVar1 = (pAVar3->state).overlay.
             super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (pAVar3->state).overlay.
              super___shared_ptr<cursespp::ILayout,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    if (peVar1 != (element_type *)0x0) {
      (*(peVar1->super_IWindowGroup)._vptr_IWindowGroup[0x12])(peVar1);
      (*(peVar1->super_IDisplayable)._vptr_IDisplayable[2])(&peVar1->super_IDisplayable);
      (*(peVar1->super_IOrderable)._vptr_IOrderable[2])(&peVar1->super_IOrderable);
      (*(peVar1->super_IWindowGroup)._vptr_IWindowGroup[6])(local_20,peVar1);
      if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if (local_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28._M_pi);
  }
  return;
}

Assistant:

void App::CheckShowOverlay() {
    ILayoutPtr top = overlays.Top();

    if (top != this->state.overlay) {
        if (this->state.overlay) {
            this->state.overlay->Hide();
        }

        this->state.overlay = top;

        this->state.overlayWindow =
            top ? dynamic_cast<IWindow*>(top.get()) : nullptr;

        ILayoutPtr newTopLayout = this->state.ActiveLayout();
        if (newTopLayout) {
            newTopLayout->Layout();
            newTopLayout->Show();
            newTopLayout->BringToTop();
            newTopLayout->FocusFirst();
        }
    }
}